

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O2

bool __thiscall cmCTestRunTest::StartTest(cmCTestRunTest *this,size_t completed,size_t total)

{
  string *psVar1;
  cmCTest *pcVar2;
  cmCTestTestProperties *pcVar3;
  pointer pbVar4;
  long lVar5;
  _Alloc_hider _Var6;
  bool bVar7;
  int iVar8;
  _Base_ptr p_Var9;
  ostream *poVar10;
  string *psVar11;
  cmCTestTestProperties *pcVar12;
  long lVar13;
  pointer pbVar14;
  cmDuration testTimeOut;
  double dVar15;
  string testName;
  string local_1c8;
  ostringstream cmCTestLog_msg;
  long alStack_198 [45];
  
  this->TotalNumberOfTests = total;
  if (this->CTest->TestProgressOutput == false) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    iVar8 = getNumWidth(total);
    *(long *)((long)alStack_198 + (long)*(pointer *)(_cmCTestLog_msg + -0x18)) =
         (long)(iVar8 * 2 + 8);
    poVar10 = std::operator<<((ostream *)&cmCTestLog_msg,"Start ");
    iVar8 = getNumWidth((long)this->TestHandler->MaxIndex);
    *(long *)(&poVar10->field_0x10 + (long)poVar10->_vptr_basic_ostream[-3]) = (long)iVar8;
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,this->TestProperties->Index);
    poVar10 = std::operator<<(poVar10,": ");
    poVar10 = std::operator<<(poVar10,(string *)this->TestProperties);
    std::endl<char,std::char_traits<char>>(poVar10);
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x1aa,testName._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&testName);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  }
  else {
    GetTestPrefix_abi_cxx11_(&local_1c8,this,completed,total);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCTestLog_msg,&local_1c8,&this->TestProperties->Name);
    std::operator+(&testName,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCTestLog_msg,"\n");
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    std::operator<<((ostream *)&cmCTestLog_msg,(string *)&testName);
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x1ae,local_1c8._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&testName);
  }
  (this->ProcessOutput)._M_string_length = 0;
  *(this->ProcessOutput)._M_dataplus._M_p = '\0';
  pcVar3 = this->TestProperties;
  (this->TestResult).Properties = pcVar3;
  (this->TestResult).ExecutionTime.__r = 0.0;
  (this->TestResult).CompressOutput = false;
  (this->TestResult).ReturnValue = -1;
  (this->TestResult).TestCount = pcVar3->Index;
  std::__cxx11::string::_M_assign((string *)&this->TestResult);
  std::__cxx11::string::_M_assign((string *)&(this->TestResult).Path);
  psVar1 = &(this->TestResult).CompletionStatus;
  if (this->TestProperties->Disabled == true) {
    std::__cxx11::string::assign((char *)psVar1);
    (this->TestResult).Status = 0;
    std::make_unique<cmProcess,cmCTestRunTest&>((cmCTestRunTest *)&cmCTestLog_msg);
    _Var6._M_p = _cmCTestLog_msg;
    _cmCTestLog_msg = (pointer)0x0;
    std::__uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>::reset
              ((__uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_> *)&this->TestProcess,
               (pointer)_Var6._M_p);
    std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::~unique_ptr
              ((unique_ptr<cmProcess,_std::default_delete<cmProcess>_> *)&cmCTestLog_msg);
    std::__cxx11::string::assign((char *)&(this->TestResult).Output);
    (this->TestResult).FullCommandLine._M_string_length = 0;
    *(this->TestResult).FullCommandLine._M_dataplus._M_p = '\0';
    return false;
  }
  std::__cxx11::string::assign((char *)psVar1);
  (this->TestResult).Status = 8;
  if ((this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    ComputeArguments(this);
    pcVar3 = this->TestProperties;
    pbVar14 = (pcVar3->Args).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pcVar12 = pcVar3;
    if (0x20 < (ulong)((long)(pcVar3->Args).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14)) {
      bVar7 = std::operator==(pbVar14 + 1,"NOT_AVAILABLE");
      if (bVar7) {
        std::make_unique<cmProcess,cmCTestRunTest&>((cmCTestRunTest *)&cmCTestLog_msg);
        _Var6._M_p = _cmCTestLog_msg;
        _cmCTestLog_msg = (pointer)0x0;
        std::__uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>::reset
                  ((__uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_> *)&this->TestProcess
                   ,(pointer)_Var6._M_p);
        std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::~unique_ptr
                  ((unique_ptr<cmProcess,_std::default_delete<cmProcess>_> *)&cmCTestLog_msg);
        testName._M_dataplus._M_p = (pointer)&testName.field_2;
        testName._M_string_length = 0;
        testName.field_2._M_local_buf[0] = '\0';
        psVar11 = cmCTest::GetConfigType_abi_cxx11_(this->CTest);
        if (psVar11->_M_string_length == 0) {
          std::__cxx11::string::assign((char *)&testName);
        }
        else {
          std::__cxx11::string::assign((char *)&testName);
          cmCTest::GetConfigType_abi_cxx11_(this->CTest);
          std::__cxx11::string::append((string *)&testName);
        }
        std::__cxx11::string::append((char *)&testName);
        poVar10 = std::operator<<(this->TestHandler->LogFile,(string *)&testName);
        std::endl<char,std::char_traits<char>>(poVar10);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar10 = std::operator<<((ostream *)&cmCTestLog_msg,(string *)&testName);
        std::endl<char,std::char_traits<char>>(poVar10);
        pcVar2 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0x1e9,local_1c8._M_dataplus._M_p,false);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        std::__cxx11::string::_M_assign((string *)&(this->TestResult).Output);
        (this->TestResult).FullCommandLine._M_string_length = 0;
        *(this->TestResult).FullCommandLine._M_dataplus._M_p = '\0';
        std::__cxx11::string::assign((char *)psVar1);
        goto LAB_001b2457;
      }
      pcVar12 = this->TestProperties;
    }
    pbVar4 = (pcVar12->RequiredFiles).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar14 = (pcVar12->RequiredFiles).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar14 != pbVar4;
        pbVar14 = pbVar14 + 1) {
      bVar7 = cmsys::SystemTools::FileExists(pbVar14);
      if (!bVar7) {
        std::make_unique<cmProcess,cmCTestRunTest&>((cmCTestRunTest *)&cmCTestLog_msg);
        _Var6._M_p = _cmCTestLog_msg;
        _cmCTestLog_msg = (pointer)0x0;
        std::__uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>::reset
                  ((__uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_> *)&this->TestProcess
                   ,(pointer)_Var6._M_p);
        std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::~unique_ptr
                  ((unique_ptr<cmProcess,_std::default_delete<cmProcess>_> *)&cmCTestLog_msg);
        poVar10 = std::operator<<(this->TestHandler->LogFile,"Unable to find required file: ");
        poVar10 = std::operator<<(poVar10,(string *)pbVar14);
        std::endl<char,std::char_traits<char>>(poVar10);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar10 = std::operator<<((ostream *)&cmCTestLog_msg,"Unable to find required file: ");
        poVar10 = std::operator<<(poVar10,(string *)pbVar14);
        std::endl<char,std::char_traits<char>>(poVar10);
        pcVar2 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                     ,0x1f9,testName._M_dataplus._M_p,false);
        std::__cxx11::string::~string((string *)&testName);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &cmCTestLog_msg,"Unable to find required file: ",pbVar14);
        std::__cxx11::string::operator=
                  ((string *)&(this->TestResult).Output,(string *)&cmCTestLog_msg);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg);
        (this->TestResult).FullCommandLine._M_string_length = 0;
        *(this->TestResult).FullCommandLine._M_dataplus._M_p = '\0';
        goto LAB_001b284c;
      }
    }
    if ((this->ActualCommand)._M_string_length != 0) {
      cmCTest::CurrentTime_abi_cxx11_((string *)&cmCTestLog_msg,this->CTest);
      std::__cxx11::string::operator=((string *)&this->StartTime,(string *)&cmCTestLog_msg);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      testTimeOut.__r = (this->TestProperties->Timeout).__r;
      this->TimeoutIsForStopTime = false;
      lVar5 = (this->CTest->StopTime).__d.__r;
      if (lVar5 != 0) {
        lVar13 = std::chrono::_V2::system_clock::now();
        dVar15 = (double)((lVar5 - lVar13) % 86400000000000) / 1000000000.0;
        if (dVar15 <= 0.0) {
          dVar15 = 0.0;
        }
        if (((testTimeOut.__r == 0.0) && (!NAN(testTimeOut.__r))) || (dVar15 < testTimeOut.__r)) {
          this->TimeoutIsForStopTime = true;
          testTimeOut.__r = dVar15;
        }
      }
      pcVar3 = this->TestProperties;
      bVar7 = ForkProcess(this,testTimeOut,pcVar3->ExplicitTimeout,&pcVar3->Environment,
                          &pcVar3->Affinity);
      return bVar7;
    }
    std::make_unique<cmProcess,cmCTestRunTest&>((cmCTestRunTest *)&cmCTestLog_msg);
    _Var6._M_p = _cmCTestLog_msg;
    _cmCTestLog_msg = (pointer)0x0;
    std::__uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>::reset
              ((__uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_> *)&this->TestProcess,
               (pointer)_Var6._M_p);
    std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::~unique_ptr
              ((unique_ptr<cmProcess,_std::default_delete<cmProcess>_> *)&cmCTestLog_msg);
    poVar10 = std::operator<<(this->TestHandler->LogFile,"Unable to find executable: ");
    poVar10 = std::operator<<(poVar10,(string *)
                                      ((pcVar3->Args).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 1));
    std::endl<char,std::char_traits<char>>(poVar10);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar10 = std::operator<<((ostream *)&cmCTestLog_msg,"Unable to find executable: ");
    poVar10 = std::operator<<(poVar10,(string *)
                                      ((pcVar3->Args).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + 1));
    std::endl<char,std::char_traits<char>>(poVar10);
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x209,testName._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&testName);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCTestLog_msg,"Unable to find executable: ",
                   (pcVar3->Args).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1);
    std::__cxx11::string::operator=((string *)&(this->TestResult).Output,(string *)&cmCTestLog_msg);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    (this->TestResult).FullCommandLine._M_string_length = 0;
    *(this->TestResult).FullCommandLine._M_dataplus._M_p = '\0';
LAB_001b284c:
    std::__cxx11::string::assign((char *)psVar1);
    (this->TestResult).Status = 0;
  }
  else {
    std::make_unique<cmProcess,cmCTestRunTest&>((cmCTestRunTest *)&cmCTestLog_msg);
    _Var6._M_p = _cmCTestLog_msg;
    _cmCTestLog_msg = (pointer)0x0;
    std::__uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_>::reset
              ((__uniq_ptr_impl<cmProcess,_std::default_delete<cmProcess>_> *)&this->TestProcess,
               (pointer)_Var6._M_p);
    std::unique_ptr<cmProcess,_std::default_delete<cmProcess>_>::~unique_ptr
              ((unique_ptr<cmProcess,_std::default_delete<cmProcess>_> *)&cmCTestLog_msg);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&testName,"Failed test dependencies:",(allocator<char> *)&cmCTestLog_msg);
    for (p_Var9 = (this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var9 != &(this->FailedDependencies)._M_t._M_impl.super__Rb_tree_header;
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmCTestLog_msg," ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var9 + 1));
      std::__cxx11::string::append((string *)&testName);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    }
    poVar10 = std::operator<<(this->TestHandler->LogFile,(string *)&testName);
    std::endl<char,std::char_traits<char>>(poVar10);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar10 = std::operator<<((ostream *)&cmCTestLog_msg,(string *)&testName);
    std::endl<char,std::char_traits<char>>(poVar10);
    pcVar2 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestRunTest.cxx"
                 ,0x1d3,local_1c8._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    std::__cxx11::string::_M_assign((string *)&(this->TestResult).Output);
    (this->TestResult).FullCommandLine._M_string_length = 0;
    *(this->TestResult).FullCommandLine._M_dataplus._M_p = '\0';
    std::__cxx11::string::assign((char *)psVar1);
LAB_001b2457:
    (this->TestResult).Status = 0;
    std::__cxx11::string::~string((string *)&testName);
  }
  return false;
}

Assistant:

bool cmCTestRunTest::StartTest(size_t completed, size_t total)
{
  this->TotalNumberOfTests = total; // save for rerun case
  if (!this->CTest->GetTestProgressOutput()) {
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               std::setw(2 * getNumWidth(total) + 8)
                 << "Start "
                 << std::setw(getNumWidth(this->TestHandler->GetMaxIndex()))
                 << this->TestProperties->Index << ": "
                 << this->TestProperties->Name << std::endl);
  } else {
    std::string testName =
      GetTestPrefix(completed, total) + this->TestProperties->Name + "\n";
    cmCTestLog(this->CTest, HANDLER_TEST_PROGRESS_OUTPUT, testName);
  }

  this->ProcessOutput.clear();

  this->TestResult.Properties = this->TestProperties;
  this->TestResult.ExecutionTime = cmDuration::zero();
  this->TestResult.CompressOutput = false;
  this->TestResult.ReturnValue = -1;
  this->TestResult.TestCount = this->TestProperties->Index;
  this->TestResult.Name = this->TestProperties->Name;
  this->TestResult.Path = this->TestProperties->Directory;

  // Return immediately if test is disabled
  if (this->TestProperties->Disabled) {
    this->TestResult.CompletionStatus = "Disabled";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    this->TestProcess = cm::make_unique<cmProcess>(*this);
    this->TestResult.Output = "Disabled";
    this->TestResult.FullCommandLine.clear();
    return false;
  }

  this->TestResult.CompletionStatus = "Failed to start";
  this->TestResult.Status = cmCTestTestHandler::BAD_COMMAND;

  // Check for failed fixture dependencies before we even look at the command
  // arguments because if we are not going to run the test, the command and
  // its arguments are irrelevant. This matters for the case where a fixture
  // dependency might be creating the executable we want to run.
  if (!this->FailedDependencies.empty()) {
    this->TestProcess = cm::make_unique<cmProcess>(*this);
    std::string msg = "Failed test dependencies:";
    for (std::string const& failedDep : this->FailedDependencies) {
      msg += " " + failedDep;
    }
    *this->TestHandler->LogFile << msg << std::endl;
    cmCTestLog(this->CTest, HANDLER_OUTPUT, msg << std::endl);
    this->TestResult.Output = msg;
    this->TestResult.FullCommandLine.clear();
    this->TestResult.CompletionStatus = "Fixture dependency failed";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
  }

  this->ComputeArguments();
  std::vector<std::string>& args = this->TestProperties->Args;
  if (args.size() >= 2 && args[1] == "NOT_AVAILABLE") {
    this->TestProcess = cm::make_unique<cmProcess>(*this);
    std::string msg;
    if (this->CTest->GetConfigType().empty()) {
      msg = "Test not available without configuration.";
      msg += "  (Missing \"-C <config>\"?)";
    } else {
      msg = "Test not available in configuration \"";
      msg += this->CTest->GetConfigType();
      msg += "\".";
    }
    *this->TestHandler->LogFile << msg << std::endl;
    cmCTestLog(this->CTest, ERROR_MESSAGE, msg << std::endl);
    this->TestResult.Output = msg;
    this->TestResult.FullCommandLine.clear();
    this->TestResult.CompletionStatus = "Missing Configuration";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
  }

  // Check if all required files exist
  for (std::string const& file : this->TestProperties->RequiredFiles) {
    if (!cmSystemTools::FileExists(file)) {
      // Required file was not found
      this->TestProcess = cm::make_unique<cmProcess>(*this);
      *this->TestHandler->LogFile << "Unable to find required file: " << file
                                  << std::endl;
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Unable to find required file: " << file << std::endl);
      this->TestResult.Output = "Unable to find required file: " + file;
      this->TestResult.FullCommandLine.clear();
      this->TestResult.CompletionStatus = "Required Files Missing";
      this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
      return false;
    }
  }
  // log and return if we did not find the executable
  if (this->ActualCommand.empty()) {
    // if the command was not found create a TestResult object
    // that has that information
    this->TestProcess = cm::make_unique<cmProcess>(*this);
    *this->TestHandler->LogFile << "Unable to find executable: " << args[1]
                                << std::endl;
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Unable to find executable: " << args[1] << std::endl);
    this->TestResult.Output = "Unable to find executable: " + args[1];
    this->TestResult.FullCommandLine.clear();
    this->TestResult.CompletionStatus = "Unable to find executable";
    this->TestResult.Status = cmCTestTestHandler::NOT_RUN;
    return false;
  }
  this->StartTime = this->CTest->CurrentTime();

  auto timeout = this->TestProperties->Timeout;

  this->TimeoutIsForStopTime = false;
  std::chrono::system_clock::time_point stop_time = this->CTest->GetStopTime();
  if (stop_time != std::chrono::system_clock::time_point()) {
    std::chrono::duration<double> stop_timeout =
      (stop_time - std::chrono::system_clock::now()) % std::chrono::hours(24);

    if (stop_timeout <= std::chrono::duration<double>::zero()) {
      stop_timeout = std::chrono::duration<double>::zero();
    }
    if (timeout == std::chrono::duration<double>::zero() ||
        stop_timeout < timeout) {
      this->TimeoutIsForStopTime = true;
      timeout = stop_timeout;
    }
  }

  return this->ForkProcess(timeout, this->TestProperties->ExplicitTimeout,
                           &this->TestProperties->Environment,
                           &this->TestProperties->Affinity);
}